

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int fits_strcasecmp(char *s1,char *s2)

{
  char cVar1;
  uint uVar2;
  __int32_t **pp_Var3;
  long lVar4;
  char cVar5;
  
  pp_Var3 = __ctype_toupper_loc();
  lVar4 = 0;
  while( true ) {
    uVar2 = (*pp_Var3)[s1[lVar4]];
    cVar1 = (char)(*pp_Var3)[s2[lVar4]];
    cVar5 = (char)uVar2;
    if (cVar5 < cVar1) {
      return -1;
    }
    if (cVar1 < cVar5) break;
    if ((uVar2 & 0xff) == 0) {
      return 0;
    }
    lVar4 = lVar4 + 1;
  }
  return 1;
}

Assistant:

int fits_strcasecmp(const char *s1, const char *s2)
{
   char c1, c2;

   for (;;) {
      c1 = toupper( *s1 );
      c2 = toupper( *s2 );

      if (c1 < c2) return(-1);
      if (c1 > c2) return(1);
      if (c1 == 0) return(0);
      s1++;
      s2++;
   }
}